

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd-core.c
# Opt level: O2

wchar_t cmd_get_arg_direction(command_conflict *cmd,char *arg,int *dir)

{
  wchar_t wVar1;
  cmd_arg_data_conflict data;
  
  wVar1 = cmd_get_arg(cmd,arg,arg_DIRECTION,&data);
  if (wVar1 == L'\0') {
    *dir = data.choice;
  }
  return wVar1;
}

Assistant:

int cmd_get_arg_direction(struct command *cmd, const char *arg, int *dir)
{
	union cmd_arg_data data;
	int err;

	if ((err = cmd_get_arg(cmd, arg, arg_DIRECTION, &data)) == CMD_OK)
		*dir = data.direction;

	return err;
}